

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O1

bool __thiscall String::maskAgainst(String *this,String *pattern)

{
  char cVar1;
  char cVar2;
  _Alloc_hider _Var3;
  uint in_ECX;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  String pattern_upper;
  String this_upper;
  String local_48;
  String local_28;
  
  toUppercase(&local_48,pattern);
  toUppercase(&local_28,this);
  cVar1 = *local_28._string._M_dataplus._M_p;
  _Var3._M_p = local_48._string._M_dataplus._M_p;
  _Var4._M_p = local_28._string._M_dataplus._M_p;
  do {
    bVar5 = true;
    if (cVar1 == '\0') {
LAB_0012fc56:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._string._M_dataplus._M_p != &local_28._string.field_2) {
        operator_delete(local_28._string._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._string._M_dataplus._M_p != &local_48._string.field_2) {
        operator_delete(local_48._string._M_dataplus._M_p);
      }
      return bVar5;
    }
    cVar2 = *_Var3._M_p;
    if (cVar2 == '*') {
      if (_Var3._M_p[1] == '\0') {
        in_ECX = 1;
        bVar6 = false;
      }
      else {
        _Var4._M_p = _Var4._M_p + -1;
        do {
          cVar1 = _Var4._M_p[1];
          _Var4._M_p = _Var4._M_p + 1;
          if (cVar1 == _Var3._M_p[1]) break;
        } while (cVar1 != '\0');
        bVar6 = cVar1 != '\0';
        in_ECX = (uint)((byte)in_ECX & bVar6);
      }
      bVar5 = SUB41(in_ECX,0);
      if (!bVar6) goto LAB_0012fc56;
      _Var3._M_p = _Var3._M_p + 1;
    }
    else if (cVar2 == '?') {
      if (_Var4._M_p[1] == '\0') {
LAB_0012fc50:
        bVar5 = false;
        goto LAB_0012fc56;
      }
    }
    else if (cVar1 != cVar2) goto LAB_0012fc50;
    _Var3._M_p = _Var3._M_p + 1;
    cVar1 = _Var4._M_p[1];
    _Var4._M_p = _Var4._M_p + 1;
  } while( true );
}

Assistant:

bool String::maskAgainst (const String& pattern) const
{
	// Elevate to uppercase for case-insensitive matching
	String pattern_upper = pattern.toUppercase();
	String this_upper = toUppercase();
	const char* maskstring = pattern_upper.c_str();
	const char* mptr = &maskstring[0];

	for (const char* sptr = this_upper.c_str(); *sptr != '\0'; sptr++)
	{
		if (*mptr == '?')
		{
			if (*(sptr + 1) == '\0')
			{
				// ? demands that there's a character here and there wasn't.
				// Therefore, mask matching fails
				return false;
			}
		}
		elif (*mptr == '*')
		{
			char end = *(++mptr);

			// If '*' is the final character of the message, all of the remaining
			// string matches against the '*'. We don't need to bother checking
			// the string any further.
			if (end == '\0')
				return true;

			// Skip to the end character
			while (*sptr != end and *sptr != '\0')
				sptr++;

			// String ended while the mask still had stuff
			if (*sptr == '\0')
				return false;
		}
		elif (*sptr != *mptr)
			return false;

		mptr++;
	}

	return true;
}